

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O0

void __thiscall
duckdb::WindowDistinctAggregatorGlobalState::PatchPrevIdcs
          (WindowDistinctAggregatorGlobalState *this)

{
  vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
  *pvVar1;
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_long>_> *p_Var2;
  long in_RDI;
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_long>_> second;
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_long>_> i;
  idx_t block_idx;
  Elements *prev_idcs;
  type in_stack_ffffffffffffffa8;
  vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
  *this_00;
  vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
  *local_18;
  
  MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
  ::LowestLevel((MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
                 *)0x1a3b3df);
  local_18 = (vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
              *)0x1;
  while( true ) {
    this_00 = local_18;
    pvVar1 = (vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
              *)::std::
                vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                ::size((vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                        *)(in_RDI + 0x2d0));
    if (pvVar1 <= this_00) break;
    ::std::
    vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
    ::at(this_00,(size_type)in_stack_ffffffffffffffa8);
    ::std::get<0ul,unsigned_long,unsigned_long>((tuple<unsigned_long,_unsigned_long> *)0x1a3b437);
    vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
              ((vector<std::tuple<unsigned_long,_unsigned_long>,_true> *)this_00,
               (size_type)in_stack_ffffffffffffffa8);
    p_Var2 = ::std::get<0ul,unsigned_long,unsigned_long>
                       ((tuple<unsigned_long,_unsigned_long> *)0x1a3b456);
    if (*p_Var2 != 0) {
      ::std::
      vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
      ::at(this_00,(size_type)in_stack_ffffffffffffffa8);
      ::std::get<1ul,unsigned_long,unsigned_long>((tuple<unsigned_long,_unsigned_long> *)0x1a3b47e);
      ::std::tuple<unsigned_long,_unsigned_long>::tuple<unsigned_long,_unsigned_long_&,_true>
                ((tuple<unsigned_long,_unsigned_long> *)this_00,
                 (unsigned_long *)in_stack_ffffffffffffffa8,(unsigned_long *)0x1a3b4a8);
      vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                ((vector<std::tuple<unsigned_long,_unsigned_long>,_true> *)this_00,
                 (size_type)in_stack_ffffffffffffffa8);
      ::std::tuple<unsigned_long,_unsigned_long>::operator=
                ((tuple<unsigned_long,_unsigned_long> *)this_00,in_stack_ffffffffffffffa8);
    }
    local_18 = (vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                *)((long)&(local_18->
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void WindowDistinctAggregatorGlobalState::PatchPrevIdcs() {
	//	13:	return prevIdcs

	// Patch up the indices at block boundaries
	// (We don't need to patch block 0.)
	auto &prev_idcs = zipped_tree.LowestLevel();
	for (idx_t block_idx = 1; block_idx < seconds.size(); ++block_idx) {
		// We only need to patch if the first index in the block
		// was a back link to the previous block (10:)
		auto i = std::get<0>(seconds.at(block_idx));
		if (std::get<0>(prev_idcs[i])) {
			auto second = std::get<1>(seconds.at(block_idx - 1));
			prev_idcs[i] = ZippedTuple(second + 1, i);
		}
	}
}